

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_simplification.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ComparisonSimplificationRule::Apply
          (ComparisonSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  ExpressionType EVar1;
  Expression *expr;
  undefined8 uVar2;
  bool bVar3;
  reference pvVar4;
  BoundComparisonExpression *pBVar5;
  ClientContext *context;
  BoundCastExpression *this_00;
  LogicalType *pLVar6;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var8;
  LogicalType target_type;
  Value uncast_constant;
  string error_message;
  Value cast_constant;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  LogicalType local_88;
  Value constant_value;
  
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                     (&pvVar4->_M_data->super_BaseExpression);
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  expr = pvVar4->_M_data;
  _Var7._M_head_impl =
       (pBVar5->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  _Var8._M_head_impl = _Var7._M_head_impl;
  if (_Var7._M_head_impl == expr) {
    _Var8._M_head_impl =
         (pBVar5->right).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  }
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value::Value(&constant_value,&local_88);
  LogicalType::~LogicalType(&local_88);
  context = Rule::GetContext((Rule *)op);
  bVar3 = ExpressionExecutor::TryEvaluateScalar(context,expr,&constant_value);
  if (bVar3) {
    if (((constant_value.is_null == true) &&
        (EVar1 = (pBVar5->super_Expression).super_BaseExpression.type,
        EVar1 != COMPARE_DISTINCT_FROM)) && (EVar1 != COMPARE_BOUNDARY_END)) {
      LogicalType::LogicalType(&local_a0,BOOLEAN);
      Value::Value(&cast_constant,&local_a0);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)&uncast_constant,&cast_constant);
      (this->super_Rule)._vptr_Rule = (_func_int **)uncast_constant.type_._0_8_;
      uncast_constant.type_.id_ = INVALID;
      uncast_constant.type_.physical_type_ = ~INVALID;
      uncast_constant.type_._2_6_ = 0;
      Value::~Value(&cast_constant);
      pLVar6 = &local_a0;
    }
    else {
      if (((_Var8._M_head_impl)->super_BaseExpression).expression_class != BOUND_CAST)
      goto LAB_0123de50;
      this_00 = BaseExpression::Cast<duckdb::BoundCastExpression>
                          (&(_Var8._M_head_impl)->super_BaseExpression);
      BoundCastExpression::source_type(&target_type,this_00);
      pLVar6 = &(this_00->super_Expression).return_type;
      bVar3 = BoundCastExpression::CastIsInvertible(&target_type,pLVar6);
      if (bVar3) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        error_message._M_string_length = 0;
        error_message.field_2._M_local_buf[0] = '\0';
        LogicalType::LogicalType(&local_b8,SQLNULL);
        Value::Value(&cast_constant,&local_b8);
        LogicalType::~LogicalType(&local_b8);
        bVar3 = Value::TryCastAs(&constant_value,*(ClientContext **)(*(long *)&op->type + 0x20),
                                 &target_type,&cast_constant,&error_message,true);
        if (bVar3) {
          if ((cast_constant.is_null == false) &&
             (bVar3 = BoundCastExpression::CastIsInvertible(pLVar6,&target_type), !bVar3)) {
            LogicalType::LogicalType(&local_d0,SQLNULL);
            Value::Value(&uncast_constant,&local_d0);
            LogicalType::~LogicalType(&local_d0);
            bVar3 = Value::TryCastAs(&cast_constant,*(ClientContext **)(*(long *)&op->type + 0x20),
                                     &constant_value.type_,&uncast_constant,&error_message,true);
            if ((!bVar3) || (bVar3 = Value::operator!=(&uncast_constant,&constant_value), bVar3)) {
              (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
              Value::~Value(&uncast_constant);
              goto LAB_0123ddcb;
            }
            Value::~Value(&uncast_constant);
          }
          _Var8._M_head_impl =
               (this_00->child).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (this_00->child).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>
                    ((duckdb *)&uncast_constant,&cast_constant);
          uVar2 = uncast_constant.type_._0_8_;
          if (_Var7._M_head_impl == expr) {
            uncast_constant.type_.id_ = INVALID;
            uncast_constant.type_.physical_type_ = ~INVALID;
            uncast_constant.type_._2_6_ = 0;
            _Var7._M_head_impl =
                 (pBVar5->left).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar5->left).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
            if (_Var7._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
            }
            _Var7._M_head_impl =
                 (pBVar5->right).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar5->right).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var8._M_head_impl;
            if (_Var7._M_head_impl != (Expression *)0x0) goto LAB_0123de19;
LAB_0123de1f:
            if (uncast_constant.type_._0_8_ != 0) {
              (**(code **)(*(long *)uncast_constant.type_._0_8_ + 8))();
            }
          }
          else {
            _Var7._M_head_impl =
                 (pBVar5->left).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar5->left).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var8._M_head_impl;
            if (_Var7._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
            }
            uVar2 = uncast_constant.type_._0_8_;
            uncast_constant.type_.id_ = INVALID;
            uncast_constant.type_.physical_type_ = ~INVALID;
            uncast_constant.type_._2_6_ = 0;
            _Var7._M_head_impl =
                 (pBVar5->right).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar5->right).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
            if (_Var7._M_head_impl != (Expression *)0x0) {
LAB_0123de19:
              (*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
              goto LAB_0123de1f;
            }
          }
          Value::~Value(&cast_constant);
          ::std::__cxx11::string::~string((string *)&error_message);
          LogicalType::~LogicalType(&target_type);
          goto LAB_0123de50;
        }
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
LAB_0123ddcb:
        Value::~Value(&cast_constant);
        ::std::__cxx11::string::~string((string *)&error_message);
      }
      else {
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
      }
      pLVar6 = &target_type;
    }
    LogicalType::~LogicalType(pLVar6);
  }
  else {
LAB_0123de50:
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  }
  Value::~Value(&constant_value);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ComparisonSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                           bool &changes_made, bool is_root) {

	auto &expr = bindings[0].get().Cast<BoundComparisonExpression>();
	auto &constant_expr = bindings[1].get();
	bool column_ref_left = expr.left.get() != &constant_expr;
	auto column_ref_expr = !column_ref_left ? expr.right.get() : expr.left.get();
	// the constant_expr is a scalar expression that we have to fold
	// use an ExpressionExecutor to execute the expression
	D_ASSERT(constant_expr.IsFoldable());
	Value constant_value;
	if (!ExpressionExecutor::TryEvaluateScalar(GetContext(), constant_expr, constant_value)) {
		return nullptr;
	}
	if (constant_value.IsNull() && !(expr.GetExpressionType() == ExpressionType::COMPARE_NOT_DISTINCT_FROM ||
	                                 expr.GetExpressionType() == ExpressionType::COMPARE_DISTINCT_FROM)) {
		// comparison with constant NULL, return NULL
		return make_uniq<BoundConstantExpression>(Value(LogicalType::BOOLEAN));
	}
	if (column_ref_expr->GetExpressionClass() == ExpressionClass::BOUND_CAST) {
		//! Here we check if we can apply the expression on the constant side
		//! We can do this if the cast itself is invertible and casting the constant is
		//! invertible in practice.
		auto &cast_expression = column_ref_expr->Cast<BoundCastExpression>();
		auto target_type = cast_expression.source_type();
		if (!BoundCastExpression::CastIsInvertible(target_type, cast_expression.return_type)) {
			return nullptr;
		}

		// Can we cast the constant at all?
		string error_message;
		Value cast_constant;
		auto new_constant =
		    constant_value.TryCastAs(rewriter.context, target_type, cast_constant, &error_message, true);
		if (!new_constant) {
			return nullptr;
		}

		// Is the constant cast invertible?
		if (!cast_constant.IsNull() &&
		    !BoundCastExpression::CastIsInvertible(cast_expression.return_type, target_type)) {
			// Is it actually invertible?
			Value uncast_constant;
			if (!cast_constant.TryCastAs(rewriter.context, constant_value.type(), uncast_constant, &error_message,
			                             true) ||
			    uncast_constant != constant_value) {
				return nullptr;
			}
		}

		//! We can cast, now we change our column_ref_expression from an operator cast to a column reference
		auto child_expression = std::move(cast_expression.child);
		auto new_constant_expr = make_uniq<BoundConstantExpression>(cast_constant);
		if (column_ref_left) {
			expr.left = std::move(child_expression);
			expr.right = std::move(new_constant_expr);
		} else {
			expr.left = std::move(new_constant_expr);
			expr.right = std::move(child_expression);
		}
	}
	return nullptr;
}